

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_Writer::PartitionWorkspace(OSTEI_Writer *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  QAM *pQVar5;
  long in_RDI;
  QAM am_3;
  iterator __end2_3;
  iterator __begin2_3;
  QAMSet *__range2_3;
  QAM am_2;
  iterator __end2_2;
  iterator __begin2_2;
  QAMSet *__range2_2;
  QAM *am_1;
  iterator __end2_1;
  iterator __begin2_1;
  QAMSet *__range2_1;
  QAM *am;
  iterator __end2;
  iterator __begin2;
  QAMSet *__range2;
  QAM *it;
  iterator __end1;
  iterator __begin1;
  QAMSet *__range1;
  size_t ptidx;
  undefined4 in_stack_fffffffffffffaa8;
  int in_stack_fffffffffffffaac;
  OSTEI_VRR_Algorithm_Base *in_stack_fffffffffffffab0;
  QAM *in_stack_fffffffffffffad0;
  QAM *in_stack_fffffffffffffaf8;
  OSTEI_HRR_Algorithm_Base *in_stack_fffffffffffffb28;
  string *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  string local_3e8 [80];
  _Self local_398;
  _Self local_390;
  undefined1 local_388 [48];
  undefined1 *local_358;
  string local_320 [80];
  _Self local_2d0;
  _Self local_2c8;
  undefined1 local_2c0 [48];
  undefined1 *local_290;
  string local_228 [32];
  reference local_208;
  _Self local_200;
  _Self local_1f8;
  undefined1 local_1f0 [48];
  undefined1 *local_1c0;
  string local_158 [32];
  reference local_138;
  _Self local_130;
  _Self local_128;
  undefined1 local_120 [48];
  undefined1 *local_f0;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [48];
  reference local_60;
  _Self local_58;
  _Self local_50;
  undefined1 local_48 [48];
  undefined1 *local_18;
  ulong local_10;
  
  poVar4 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
  std::operator<<(poVar4,"// partition workspace\n");
  local_10 = 0;
  OSTEI_HRR_Writer::Algo(*(OSTEI_HRR_Writer **)(in_RDI + 0x28));
  OSTEI_HRR_Algorithm_Base::TopAM
            ((OSTEI_HRR_Algorithm_Base *)
             CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  local_18 = local_48;
  local_50._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                  CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  local_58._M_node =
       (_Base_ptr)
       std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                 ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                  CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
  while( true ) {
    bVar1 = std::operator!=(&local_50,&local_58);
    if (!bVar1) break;
    local_60 = std::_Rb_tree_const_iterator<QAM>::operator*
                         ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffab0);
    bVar1 = GeneratorInfoBase::IsFinalAM
                      ((GeneratorInfoBase *)in_stack_fffffffffffffab0,
                       (QAM *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    if (!bVar1) {
      poVar4 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"double * const ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"",&local_b1);
      ArrVarName((QAM *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 in_stack_fffffffffffffb90);
      poVar4 = std::operator<<(poVar4,local_90);
      poVar4 = std::operator<<(poVar4," = work + (SIMINT_NSHELL_SIMD * ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
      std::operator<<(poVar4,");\n");
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      QAM::QAM((QAM *)in_stack_fffffffffffffab0,
               (QAM *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      in_stack_fffffffffffffb9c = NCART(in_stack_fffffffffffffad0);
      local_10 = (long)in_stack_fffffffffffffb9c + local_10;
      QAM::~QAM((QAM *)0x157769);
    }
    std::_Rb_tree_const_iterator<QAM>::operator++
              ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffab0);
  }
  std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
            ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x15758b);
  bVar1 = OSTEI_GeneratorInfo::UseStack(*(OSTEI_GeneratorInfo **)(in_RDI + 0x18));
  if (bVar1) {
    OSTEI_VRR_Writer::Algo(*(OSTEI_VRR_Writer **)(in_RDI + 0x20));
    OSTEI_VRR_Algorithm_Base::GetAllAM
              ((OSTEI_VRR_Algorithm_Base *)
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_f0 = local_120;
    local_128._M_node =
         (_Base_ptr)
         std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                   ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                    CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_130._M_node =
         (_Base_ptr)
         std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                   ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                    CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    while( true ) {
      bVar1 = std::operator!=(&local_128,&local_130);
      if (!bVar1) break;
      local_138 = std::_Rb_tree_const_iterator<QAM>::operator*
                            ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffab0);
      poVar4 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"SIMINT_DBLTYPE ");
      PrimVarName_abi_cxx11_(in_stack_fffffffffffffaf8);
      poVar4 = std::operator<<(poVar4,local_158);
      poVar4 = std::operator<<(poVar4,"[");
      OSTEI_VRR_Writer::Algo(*(OSTEI_VRR_Writer **)(in_RDI + 0x20));
      QAM::QAM((QAM *)in_stack_fffffffffffffab0,
               (QAM *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      iVar3 = OSTEI_VRR_Algorithm_Base::GetMReq
                        (in_stack_fffffffffffffab0,
                         (QAM *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3 + 1);
      poVar4 = std::operator<<(poVar4," * ");
      QAM::QAM((QAM *)in_stack_fffffffffffffab0,
               (QAM *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      iVar3 = NCART(in_stack_fffffffffffffad0);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::operator<<(poVar4,"] SIMINT_ALIGN_ARRAY_DBL;\n");
      QAM::~QAM((QAM *)0x157a81);
      QAM::~QAM((QAM *)0x157a8e);
      std::__cxx11::string::~string(local_158);
      std::_Rb_tree_const_iterator<QAM>::operator++
                ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffab0);
    }
    std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
              ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x1578d4);
  }
  else {
    poVar4 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,
                             "SIMINT_DBLTYPE * const primwork = (SIMINT_DBLTYPE *)(work + SIMINT_NSHELL_SIMD*"
                            );
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
    std::operator<<(poVar4,");\n");
    local_10 = 0;
    OSTEI_VRR_Writer::Algo(*(OSTEI_VRR_Writer **)(in_RDI + 0x20));
    OSTEI_VRR_Algorithm_Base::GetAllAM
              ((OSTEI_VRR_Algorithm_Base *)
               CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_1c0 = local_1f0;
    local_1f8._M_node =
         (_Base_ptr)
         std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                   ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                    CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_200._M_node =
         (_Base_ptr)
         std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                   ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                    CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    while( true ) {
      bVar1 = std::operator!=(&local_1f8,&local_200);
      if (!bVar1) break;
      local_208 = std::_Rb_tree_const_iterator<QAM>::operator*
                            ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffab0);
      poVar4 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      poVar4 = std::operator<<(poVar4,"SIMINT_DBLTYPE * const restrict ");
      PrimVarName_abi_cxx11_(in_stack_fffffffffffffaf8);
      poVar4 = std::operator<<(poVar4,local_228);
      in_stack_fffffffffffffb28 =
           (OSTEI_HRR_Algorithm_Base *)std::operator<<(poVar4," = primwork + ");
      poVar4 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffb28,local_10);
      std::operator<<(poVar4,";\n");
      std::__cxx11::string::~string(local_228);
      OSTEI_VRR_Writer::Algo(*(OSTEI_VRR_Writer **)(in_RDI + 0x20));
      QAM::QAM((QAM *)in_stack_fffffffffffffab0,
               (QAM *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      iVar3 = OSTEI_VRR_Algorithm_Base::GetMReq
                        (in_stack_fffffffffffffab0,
                         (QAM *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      QAM::QAM((QAM *)in_stack_fffffffffffffab0,
               (QAM *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      iVar2 = NCART(in_stack_fffffffffffffad0);
      local_10 = (long)((iVar3 + 1) * iVar2) + local_10;
      QAM::~QAM((QAM *)0x157da6);
      QAM::~QAM((QAM *)0x157db3);
      std::_Rb_tree_const_iterator<QAM>::operator++
                ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffab0);
    }
    std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
              ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x157c14);
  }
  bVar1 = OSTEI_GeneratorInfo::UseStack(*(OSTEI_GeneratorInfo **)(in_RDI + 0x18));
  if (bVar1) {
    OSTEI_HRR_Writer::Algo(*(OSTEI_HRR_Writer **)(in_RDI + 0x28));
    OSTEI_HRR_Algorithm_Base::GetIntermediates(in_stack_fffffffffffffb28);
    local_290 = local_2c0;
    local_2c8._M_node =
         (_Base_ptr)
         std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                   ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                    CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_2d0._M_node =
         (_Base_ptr)
         std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                   ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                    CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    while( true ) {
      bVar1 = std::operator!=(&local_2c8,&local_2d0);
      if (!bVar1) break;
      std::_Rb_tree_const_iterator<QAM>::operator*
                ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffab0);
      QAM::QAM((QAM *)in_stack_fffffffffffffab0,
               (QAM *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      poVar4 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      pQVar5 = (QAM *)std::operator<<(poVar4,"double ");
      HRRVarName_abi_cxx11_(pQVar5);
      poVar4 = std::operator<<((ostream *)pQVar5,local_320);
      poVar4 = std::operator<<(poVar4,"[");
      QAM::QAM((QAM *)in_stack_fffffffffffffab0,
               (QAM *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      iVar3 = NCART(in_stack_fffffffffffffad0);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::operator<<(poVar4,"];\n");
      QAM::~QAM((QAM *)0x157ff3);
      std::__cxx11::string::~string(local_320);
      QAM::~QAM((QAM *)0x15800d);
      std::_Rb_tree_const_iterator<QAM>::operator++
                ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffab0);
    }
    std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
              ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x157ef1);
  }
  else {
    poVar4 = std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"double * const hrrwork = (double *)(primwork + ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_10);
    std::operator<<(poVar4,");\n");
    local_10 = 0;
    OSTEI_HRR_Writer::Algo(*(OSTEI_HRR_Writer **)(in_RDI + 0x28));
    OSTEI_HRR_Algorithm_Base::GetIntermediates(in_stack_fffffffffffffb28);
    local_358 = local_388;
    local_390._M_node =
         (_Base_ptr)
         std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::begin
                   ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                    CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    local_398._M_node =
         (_Base_ptr)
         std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::end
                   ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)
                    CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    while( true ) {
      bVar1 = std::operator!=(&local_390,&local_398);
      if (!bVar1) break;
      std::_Rb_tree_const_iterator<QAM>::operator*
                ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffab0);
      QAM::QAM((QAM *)in_stack_fffffffffffffab0,
               (QAM *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      pQVar5 = (QAM *)std::operator<<(*(ostream **)(in_RDI + 8),(string *)indent1_abi_cxx11_);
      poVar4 = std::operator<<((ostream *)pQVar5,"double * const ");
      HRRVarName_abi_cxx11_(in_stack_fffffffffffffaf8);
      poVar4 = std::operator<<(poVar4,local_3e8);
      poVar4 = std::operator<<(poVar4," = hrrwork + ");
      in_stack_fffffffffffffab0 =
           (OSTEI_VRR_Algorithm_Base *)std::ostream::operator<<(poVar4,local_10);
      std::operator<<((ostream *)in_stack_fffffffffffffab0,";\n");
      std::__cxx11::string::~string(local_3e8);
      QAM::QAM((QAM *)in_stack_fffffffffffffab0,
               (QAM *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
      in_stack_fffffffffffffaac = NCART(pQVar5);
      local_10 = (long)in_stack_fffffffffffffaac + local_10;
      QAM::~QAM((QAM *)0x1582af);
      QAM::~QAM((QAM *)0x1582bc);
      std::_Rb_tree_const_iterator<QAM>::operator++
                ((_Rb_tree_const_iterator<QAM> *)in_stack_fffffffffffffab0);
    }
    std::set<QAM,_std::less<QAM>,_std::allocator<QAM>_>::~set
              ((set<QAM,_std::less<QAM>,_std::allocator<QAM>_> *)0x158186);
  }
  std::operator<<(*(ostream **)(in_RDI + 8),"\n\n");
  return;
}

Assistant:

void OSTEI_Writer::PartitionWorkspace(void) const
{
    os_ << indent1 << "// partition workspace\n";
    size_t ptidx = 0;

    ////////////////////////////////////////
    // For HRR batched quartets
    ////////////////////////////////////////
    for(const auto & it : hrr_writer_.Algo().TopAM())
    {
        if(!info_.IsFinalAM(it))
        {
            os_ << indent1 << "double * const " << ArrVarName(it) << " = work + (SIMINT_NSHELL_SIMD * " << ptidx << ");\n";
            ptidx += NCART(it);
        }
    }


    ////////////////////////////////////////
    // For VRR
    ////////////////////////////////////////
    // Note: vrr_writer handles the prim arrays for s_s_s_s
    //       so we always want to run this

    if(info_.UseStack())
    {
        for(const auto & am : vrr_writer_.Algo().GetAllAM())
        {
            os_ << indent1 << "SIMINT_DBLTYPE " << PrimVarName(am)
                << "[" << (vrr_writer_.Algo().GetMReq(am)+1) << " * "
                << NCART(am) << "] SIMINT_ALIGN_ARRAY_DBL;\n";
        }
    }
    else
    {
        os_ << indent1 << "SIMINT_DBLTYPE * const primwork = (SIMINT_DBLTYPE *)(work + SIMINT_NSHELL_SIMD*" << ptidx << ");\n";
        ptidx = 0;

        for(const auto & am : vrr_writer_.Algo().GetAllAM())
        {
            // add +1 fromm required m values to account for 0
            os_ << indent1 << "SIMINT_DBLTYPE * const restrict " << PrimVarName(am)
                << " = primwork + " << ptidx << ";\n";

            ptidx += (vrr_writer_.Algo().GetMReq(am)+1) * NCART(am);
        }
    }

    /////////////////////
    // HRR Intermediates

    // A temporary is needed even for the "final am" if we are doing derivatives, since
    // it will actually be an intermediate
    if(info_.UseStack())
    {
        for(auto am : hrr_writer_.Algo().GetIntermediates())
            os_ << indent1 << "double " << HRRVarName(am) << "[" << NCART(am) << "];\n";
    }
    else
    {
        os_ << indent1 << "double * const hrrwork = (double *)(primwork + " << ptidx << ");\n";
        ptidx = 0;
        for(auto am : hrr_writer_.Algo().GetIntermediates())
        {
            os_ << indent1 << "double * const " << HRRVarName(am) << " = hrrwork + " << ptidx << ";\n";
            ptidx += NCART(am);
        }
    }

    os_ << "\n\n";
}